

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

unqlite_col * unqliteCollectionFetch(unqlite_vm *pVm,SyString *pName,int iFlag)

{
  int iVar1;
  unqlite_col *puVar2;
  unqlite_col *local_20;
  
  local_20 = unqliteVmFetchCollection(pVm,pName);
  puVar2 = local_20;
  if (local_20 == (unqlite_col *)0x0) {
    iVar1 = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,0,&local_20);
    puVar2 = (unqlite_col *)0x0;
    if (iVar1 == 0) {
      puVar2 = local_20;
    }
  }
  return puVar2;
}

Assistant:

UNQLITE_PRIVATE unqlite_col * unqliteCollectionFetch(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName, /* Lookup key */
	int iFlag        /* Control flag */
	)
{
	unqlite_col *pCol = 0; /* cc warning */
	int rc;
	/* Check if the collection is already loaded in memory */
	pCol = unqliteVmFetchCollection(pVm,pName);
	if( pCol ){
		/* Already loaded in memory*/
		return pCol;
	}
	if( (iFlag & UNQLITE_VM_AUTO_LOAD) == 0 ){
		return 0;
	}
	/* Ask the storage engine for the collection */
	rc = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,0,&pCol);
	/* Return to the caller */
	return rc == UNQLITE_OK ? pCol : 0;
}